

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::assign<float>
          (CImg<unsigned_int> *this,float *values,uint size_x,uint size_y,uint size_z,uint size_c)

{
  uint *puVar1;
  ulongT uVar2;
  uint *_maxptrd;
  uint *ptrd;
  float *ptrs;
  size_t siz;
  uint size_c_local;
  uint size_z_local;
  uint size_y_local;
  uint size_x_local;
  float *values_local;
  CImg<unsigned_int> *this_local;
  
  if ((values == (float *)0x0) ||
     ((ulong)size_x * (ulong)size_y * (ulong)size_z * (ulong)size_c == 0)) {
    this_local = assign(this);
  }
  else {
    assign(this,size_x,size_y,size_z,size_c);
    _maxptrd = this->_data;
    puVar1 = this->_data;
    uVar2 = size(this);
    ptrd = (uint *)values;
    for (; this_local = this, _maxptrd < puVar1 + uVar2; _maxptrd = _maxptrd + 1) {
      *_maxptrd = (uint)(long)(float)*ptrd;
      ptrd = ptrd + 1;
    }
  }
  return this_local;
}

Assistant:

CImg<T>& assign(const t *const values, const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const size_t siz = (size_t)size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      assign(size_x,size_y,size_z,size_c);
      const t *ptrs = values; cimg_for(*this,ptrd,T) *ptrd = (T)*(ptrs++);
      return *this;
    }